

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O0

_Bool buy_stat(wchar_t choice,int *stats_local,int *points_spent_local,int *points_inc_local,
              int *points_left_local,_Bool update_display)

{
  int iVar1;
  wchar_t stat_cost;
  _Bool update_display_local;
  int *points_left_local_local;
  int *points_inc_local_local;
  int *points_spent_local_local;
  int *stats_local_local;
  wchar_t choice_local;
  
  if (((choice < L'\x05') && (L'\xffffffff' < choice)) && (stats_local[choice] < 0x12)) {
    iVar1 = birth_stat_costs[stats_local[choice] + 1];
    if (iVar1 != points_inc_local[choice]) {
      __assert_fail("stat_cost == points_inc_local[choice]",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/player-birth.c"
                    ,0x2e7,"_Bool buy_stat(int, int *, int *, int *, int *, _Bool)");
    }
    if (iVar1 <= *points_left_local) {
      stats_local[choice] = stats_local[choice] + 1;
      points_spent_local[choice] = iVar1 + points_spent_local[choice];
      points_inc_local[choice] = birth_stat_costs[stats_local[choice] + 1];
      *points_left_local = *points_left_local - iVar1;
      if (update_display) {
        event_signal_birthpoints(points_spent_local,points_inc_local,*points_left_local);
        recalculate_stats(stats_local,*points_left_local);
      }
      return true;
    }
  }
  return false;
}

Assistant:

static bool buy_stat(int choice, int stats_local[STAT_MAX],
		int points_spent_local[STAT_MAX],
		int points_inc_local[STAT_MAX],
		int *points_left_local, bool update_display)
{
	/* Must be a valid stat, and have a "base" of below 18 to be adjusted */
	if (!(choice >= STAT_MAX || choice < 0) &&	(stats_local[choice] < 18)) {
		/* Get the cost of buying the extra point (beyond what
		   it has already cost to get this far). */
		int stat_cost = birth_stat_costs[stats_local[choice] + 1];

		assert(stat_cost == points_inc_local[choice]);
		if (stat_cost <= *points_left_local) {
			stats_local[choice]++;
			points_spent_local[choice] += stat_cost;
			points_inc_local[choice] =
				birth_stat_costs[stats_local[choice] + 1];
			*points_left_local -= stat_cost;

			if (update_display) {
				/* Tell the UI the new points situation. */
				event_signal_birthpoints(points_spent_local,
					points_inc_local, *points_left_local);

				/* Recalculate everything that's changed because
				   the stat has changed, and inform the UI. */
				recalculate_stats(stats_local, *points_left_local);
			}

			return true;
		}
	}

	/* Didn't adjust stat. */
	return false;
}